

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O2

ndn_bitset_t
fwd_multicast(uint8_t *packet,size_t length,ndn_bitset_t out_faces,ndn_table_id_t in_face)

{
  ndn_face_table_t nVar1;
  uint uVar2;
  undefined6 in_register_0000000a;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = 0;
  while (out_faces != 0) {
    uVar2 = 0;
    uVar4 = (uint)(-out_faces & out_faces);
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    out_faces = -out_faces & out_faces ^ out_faces;
    if ((uVar2 != (uint)CONCAT62(in_register_0000000a,in_face)) &&
       (nVar1 = forwarder.facetab[(ulong)uVar2 + 1], nVar1 != (ndn_face_table_t)0x0)) {
      if (*(char *)((long)nVar1 + 0x22) != '\x01') {
        (**(code **)nVar1)(nVar1);
      }
      (**(code **)((long)nVar1 + 8))(nVar1,packet,length);
      uVar3 = uVar3 | 1L << ((ulong)uVar2 & 0x3f);
    }
  }
  return uVar3;
}

Assistant:

static ndn_bitset_t
fwd_multicast(uint8_t* packet,
              size_t length,
              ndn_bitset_t out_faces,
              ndn_table_id_t in_face)
{
  ndn_table_id_t id;
  ndn_face_intf_t* face;
  ndn_bitset_t ret = 0;

  while(out_faces != 0){
    id = bitset_pop_least(&out_faces);
    face = forwarder.facetab->slots[id];
    if(id != in_face && face != NULL){
      ndn_face_send(face, packet, length);
      ret = bitset_set(ret, id);
    }
  }
  return ret;
}